

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  pointer pfVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  pointer pfVar20;
  long lVar21;
  ulong uVar22;
  ushort uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  double dVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float local_28;
  
  computeOutput(this,hidden,output);
  iVar2 = this->osz_;
  if (0 < (long)iVar2) {
    pfVar20 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = 0;
    auVar29 = ZEXT464((uint)*pfVar20);
    do {
      auVar16 = vmaxss_avx(auVar29._0_16_,ZEXT416((uint)pfVar20[lVar21]));
      auVar29 = ZEXT1664(auVar16);
      lVar21 = lVar21 + 1;
    } while (iVar2 != lVar21);
    if (0 < iVar2) {
      auVar30 = ZEXT1664(ZEXT816(0) << 0x40);
      lVar21 = 0;
      do {
        dVar28 = exp((double)(pfVar20[lVar21] - auVar29._0_4_));
        local_28 = auVar30._0_4_;
        pfVar20 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        auVar29 = ZEXT464((uint)auVar29._0_4_);
        pfVar20[lVar21] = (float)dVar28;
        lVar21 = lVar21 + 1;
        iVar2 = this->osz_;
        local_28 = local_28 + (float)dVar28;
        auVar30 = ZEXT464((uint)local_28);
      } while (lVar21 < iVar2);
      if (0 < iVar2) {
        auVar29 = vbroadcastss_avx512f(ZEXT416((uint)local_28));
        auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar26,auVar30);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar17 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar27,auVar25,2);
          bVar19 = (byte)uVar17;
          uVar23 = CONCAT11(bVar19,bVar18);
          pfVar1 = pfVar20 + uVar22;
          auVar26._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * (int)pfVar1[1];
          auVar26._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
          auVar26._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * (int)pfVar1[2];
          auVar26._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * (int)pfVar1[3];
          auVar26._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * (int)pfVar1[4];
          auVar26._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * (int)pfVar1[5];
          auVar26._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * (int)pfVar1[6];
          auVar26._28_4_ = (uint)((byte)(uVar23 >> 7) & 1) * (int)pfVar1[7];
          auVar26._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
          auVar26._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
          auVar26._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
          auVar26._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
          auVar26._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
          auVar26._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
          auVar26._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
          auVar26._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
          auVar26 = vdivps_avx512f(auVar26,auVar29);
          pfVar1 = pfVar20 + uVar22;
          bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
          bVar10 = (bool)(bVar19 >> 1 & 1);
          bVar11 = (bool)(bVar19 >> 2 & 1);
          bVar12 = (bool)(bVar19 >> 3 & 1);
          bVar13 = (bool)(bVar19 >> 4 & 1);
          bVar14 = (bool)(bVar19 >> 5 & 1);
          bVar15 = (bool)(bVar19 >> 6 & 1);
          *pfVar1 = (float)((uint)(bVar18 & 1) * auVar26._0_4_ |
                           (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
          pfVar1[1] = (float)((uint)bVar3 * auVar26._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
          pfVar1[2] = (float)((uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
          pfVar1[3] = (float)((uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
          pfVar1[4] = (float)((uint)bVar6 * auVar26._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
          pfVar1[5] = (float)((uint)bVar7 * auVar26._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
          pfVar1[6] = (float)((uint)bVar8 * auVar26._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
          pfVar1[7] = (float)((uint)bVar9 * auVar26._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
          pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar26._32_4_ |
                             (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
          pfVar1[9] = (float)((uint)bVar10 * auVar26._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
          pfVar1[10] = (float)((uint)bVar11 * auVar26._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
          pfVar1[0xb] = (float)((uint)bVar12 * auVar26._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
          pfVar1[0xc] = (float)((uint)bVar13 * auVar26._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
          pfVar1[0xd] = (float)((uint)bVar14 * auVar26._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
          pfVar1[0xe] = (float)((uint)bVar15 * auVar26._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
          pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar26._60_4_ |
                               (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
          uVar22 = uVar22 + 0x10;
        } while ((iVar2 + 0xfU & 0xfffffff0) != uVar22);
      }
    }
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
	computeOutput(hidden, output);
	real max = output[0], z = 0.0;
	for (int32_t i = 0; i < osz_; i++) {
		max = std::max(output[i], max);
	}
	for (int32_t i = 0; i < osz_; i++) {
		// std::cout << output[i] << ":";
		output[i] = exp(output[i] - max);
		z += output[i];
		// std::cout << output[i] << " ";
		
	}

	// std::cout << z << std::endl;
	for (int32_t i = 0; i < osz_; i++) {
		output[i] /= z;
	}
}